

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInnerProductDynamicQuantizationConversionParameterValidation(void)

{
  RepeatedField<float> *this;
  pointer pcVar1;
  string *psVar2;
  bool bVar3;
  TypeUnion TVar4;
  ModelDescription *pMVar5;
  Type *pTVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  Type *this_00;
  LayerUnion this_01;
  WeightParams *this_02;
  QuantizationParams *pQVar9;
  ostream *poVar10;
  LinearQuantizationParams *pLVar11;
  long lVar12;
  int iVar13;
  int iVar14;
  Result res;
  Model m1;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  undefined1 local_88 [8];
  _Alloc_hider local_80;
  undefined1 local_78 [24];
  Model local_60;
  
  CoreML::Specification::Model::Model(&local_60);
  if (local_60._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_60);
    local_60._oneof_case_[0] = 500;
    TVar4.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(TVar4.neuralnetwork_);
    local_60.Type_.pipelineclassifier_ = TVar4.pipelineclassifier_;
  }
  TVar4 = local_60.Type_;
  (local_60.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  if (local_60.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_60.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_60.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"A","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
    pFVar7 = pTVar6->type_;
    if (pFVar7 == (FeatureType *)0x0) {
      pFVar7 = (FeatureType *)operator_new(0x28);
      CoreML::Specification::FeatureType::FeatureType(pFVar7);
      pTVar6->type_ = pFVar7;
    }
  }
  if (pFVar7->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar7->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  iVar13 = (pAVar8->shape_).current_size_;
  if (iVar13 == (pAVar8->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar8->shape_,iVar13 + 1);
    iVar13 = (pAVar8->shape_).current_size_;
  }
  (pAVar8->shape_).current_size_ = iVar13 + 1;
  ((pAVar8->shape_).rep_)->elements[iVar13] = 1;
  if (local_60.description_ == (ModelDescription *)0x0) {
    pMVar5 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar5);
    local_60.description_ = pMVar5;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_60.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"B","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar6->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  pFVar7 = pTVar6->type_;
  if (pFVar7 == (FeatureType *)0x0) {
    pFVar7 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar7);
    pTVar6->type_ = pFVar7;
  }
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(TVar4.pipeline_)->models_,(Type *)0x0);
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"inner_product","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"B");
  if (this_00->_oneof_case_[0] == 0x8c) {
    this_01 = this_00->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x8c;
    this_01.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01.innerproduct_);
    (this_00->layer_).innerproduct_ = (InnerProductLayerParams *)this_01;
  }
  (this_01.innerproduct_)->inputchannels_ = 4;
  (this_01.innerproduct_)->outputchannels_ = 2;
  *(undefined2 *)&((this_01.convolution_)->stride_).rep_ = 0x100;
  this_02 = (WeightParams *)((this_01.activation_)->NonlinearityType_).linear_;
  if (this_02 == (WeightParams *)0x0) {
    this_02 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(this_02);
    ((this_01.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)this_02;
  }
  local_b0 = (undefined1  [8])local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"11111111","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_02->int8rawvalue_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_b0);
  if (local_b0 != (undefined1  [8])local_a0) {
    operator_delete((void *)local_b0,local_a0._0_8_ + 1);
  }
  pQVar9 = this_02->quantization_;
  if (pQVar9 == (QuantizationParams *)0x0) {
    pQVar9 = (QuantizationParams *)operator_new(0x28);
    CoreML::Specification::QuantizationParams::QuantizationParams(pQVar9);
    this_02->quantization_ = pQVar9;
  }
  pQVar9->numberofbits_ = 8;
  if (pQVar9->_oneof_case_[0] == 0x65) {
    pLVar11 = (pQVar9->QuantizationType_).linearquantization_;
  }
  else {
    CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar9);
    pQVar9->_oneof_case_[0] = 0x65;
    pLVar11 = (LinearQuantizationParams *)operator_new(0x40);
    CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar11);
    (pQVar9->QuantizationType_).linearquantization_ = pLVar11;
  }
  iVar13 = (pLVar11->scale_).current_size_;
  if (iVar13 == (pLVar11->scale_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(&pLVar11->scale_,iVar13 + 1);
    iVar13 = (pLVar11->scale_).current_size_;
  }
  (pLVar11->scale_).current_size_ = iVar13 + 1;
  ((pLVar11->scale_).rep_)->elements[iVar13] = 4.0;
  CoreML::validate<(MLModelType)500>((Result *)local_b0,&local_60);
  bVar3 = CoreML::Result::good((Result *)local_b0);
  if (bVar3) {
    (this_01.innerproduct_)->hasbias_ = true;
    CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
    local_b0 = local_88;
    std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
    pcVar1 = local_78 + 8;
    if (local_80._M_p != pcVar1) {
      operator_delete(local_80._M_p,local_78._8_8_ + 1);
    }
    bVar3 = CoreML::Result::good((Result *)local_b0);
    if (bVar3) {
      (this_01.innerproduct_)->hasbias_ = false;
      pQVar9 = this_02->quantization_;
      if (pQVar9 == (QuantizationParams *)0x0) {
        pQVar9 = (QuantizationParams *)operator_new(0x28);
        CoreML::Specification::QuantizationParams::QuantizationParams(pQVar9);
        this_02->quantization_ = pQVar9;
      }
      if (pQVar9->_oneof_case_[0] == 0x65) {
        pLVar11 = (pQVar9->QuantizationType_).linearquantization_;
      }
      else {
        CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar9);
        pQVar9->_oneof_case_[0] = 0x65;
        pLVar11 = (LinearQuantizationParams *)operator_new(0x40);
        CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar11);
        (pQVar9->QuantizationType_).linearquantization_ = pLVar11;
      }
      iVar13 = (pLVar11->bias_).current_size_;
      if (iVar13 == (pLVar11->bias_).total_size_) {
        google::protobuf::RepeatedField<float>::Reserve(&pLVar11->bias_,iVar13 + 1);
        iVar13 = (pLVar11->bias_).current_size_;
      }
      (pLVar11->bias_).current_size_ = iVar13 + 1;
      ((pLVar11->bias_).rep_)->elements[iVar13] = 1.0;
      CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
      local_b0 = local_88;
      std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
      if (local_80._M_p != pcVar1) {
        operator_delete(local_80._M_p,local_78._8_8_ + 1);
      }
      bVar3 = CoreML::Result::good((Result *)local_b0);
      if (bVar3) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x283);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
      }
      else {
        pQVar9 = this_02->quantization_;
        if (pQVar9 == (QuantizationParams *)0x0) {
          pQVar9 = (QuantizationParams *)operator_new(0x28);
          CoreML::Specification::QuantizationParams::QuantizationParams(pQVar9);
          this_02->quantization_ = pQVar9;
        }
        if (pQVar9->_oneof_case_[0] == 0x65) {
          (((pQVar9->QuantizationType_).linearquantization_)->bias_).current_size_ = 0;
        }
        else {
          CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar9);
          pQVar9->_oneof_case_[0] = 0x65;
          pLVar11 = (LinearQuantizationParams *)operator_new(0x40);
          CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar11);
          (pQVar9->QuantizationType_).linearquantization_ = pLVar11;
          pQVar9 = this_02->quantization_;
          (pLVar11->bias_).current_size_ = 0;
          if (pQVar9 == (QuantizationParams *)0x0) {
            pQVar9 = (QuantizationParams *)operator_new(0x28);
            CoreML::Specification::QuantizationParams::QuantizationParams(pQVar9);
            this_02->quantization_ = pQVar9;
          }
        }
        pQVar9->numberofbits_ = 7;
        CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
        local_b0 = local_88;
        std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
        if (local_80._M_p != pcVar1) {
          operator_delete(local_80._M_p,local_78._8_8_ + 1);
        }
        bVar3 = CoreML::Result::good((Result *)local_b0);
        if (bVar3) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x289);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        }
        else {
          pQVar9 = this_02->quantization_;
          if (pQVar9 == (QuantizationParams *)0x0) {
            pQVar9 = (QuantizationParams *)operator_new(0x28);
            CoreML::Specification::QuantizationParams::QuantizationParams(pQVar9);
            this_02->quantization_ = pQVar9;
          }
          pQVar9->numberofbits_ = 8;
          if (pQVar9->_oneof_case_[0] == 0x66) {
            pLVar11 = (pQVar9->QuantizationType_).linearquantization_;
          }
          else {
            CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar9);
            pQVar9->_oneof_case_[0] = 0x66;
            pLVar11 = (LinearQuantizationParams *)operator_new(0x28);
            CoreML::Specification::LookUpTableQuantizationParams::LookUpTableQuantizationParams
                      ((LookUpTableQuantizationParams *)pLVar11);
            (pQVar9->QuantizationType_).lookuptablequantization_ =
                 (LookUpTableQuantizationParams *)pLVar11;
          }
          iVar13 = (pLVar11->scale_).current_size_;
          if (iVar13 == (pLVar11->scale_).total_size_) {
            google::protobuf::RepeatedField<float>::Reserve(&pLVar11->scale_,iVar13 + 1);
            iVar13 = (pLVar11->scale_).current_size_;
          }
          (pLVar11->scale_).current_size_ = iVar13 + 1;
          ((pLVar11->scale_).rep_)->elements[iVar13] = 1.0;
          CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
          local_b0 = local_88;
          std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
          if (local_80._M_p != pcVar1) {
            operator_delete(local_80._M_p,local_78._8_8_ + 1);
          }
          bVar3 = CoreML::Result::good((Result *)local_b0);
          if (!bVar3) {
            pQVar9 = this_02->quantization_;
            if (pQVar9 == (QuantizationParams *)0x0) {
              pQVar9 = (QuantizationParams *)operator_new(0x28);
              CoreML::Specification::QuantizationParams::QuantizationParams(pQVar9);
              this_02->quantization_ = pQVar9;
            }
            if (pQVar9->_oneof_case_[0] == 0x65) {
              pLVar11 = (pQVar9->QuantizationType_).linearquantization_;
            }
            else {
              CoreML::Specification::QuantizationParams::clear_QuantizationType(pQVar9);
              pQVar9->_oneof_case_[0] = 0x65;
              pLVar11 = (LinearQuantizationParams *)operator_new(0x40);
              CoreML::Specification::LinearQuantizationParams::LinearQuantizationParams(pLVar11);
              (pQVar9->QuantizationType_).linearquantization_ = pLVar11;
            }
            iVar13 = (pLVar11->scale_).current_size_;
            if (iVar13 == (pLVar11->scale_).total_size_) {
              google::protobuf::RepeatedField<float>::Reserve(&pLVar11->scale_,iVar13 + 1);
              iVar13 = (pLVar11->scale_).current_size_;
            }
            (pLVar11->scale_).current_size_ = iVar13 + 1;
            ((pLVar11->scale_).rep_)->elements[iVar13] = 4.0;
            psVar2 = (this_02->int8rawvalue_).ptr_;
            if (psVar2 != (string *)
                          &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
              psVar2->_M_string_length = 0;
              *(psVar2->_M_dataplus)._M_p = '\0';
            }
            local_88 = (undefined1  [8])local_78;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"11111111","");
            google::protobuf::internal::ArenaStringPtr::SetNoArena
                      (&this_02->rawvalue_,
                       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
                       (string *)local_88);
            if (local_88 != (undefined1  [8])local_78) {
              operator_delete((void *)local_88,local_78._0_8_ + 1);
            }
            CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
            local_b0 = local_88;
            std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
            if (local_80._M_p != pcVar1) {
              operator_delete(local_80._M_p,local_78._8_8_ + 1);
            }
            bVar3 = CoreML::Result::good((Result *)local_b0);
            if (bVar3) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x296);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," was false, expected true.",0x1a);
            }
            else {
              psVar2 = (this_02->rawvalue_).ptr_;
              if (psVar2 != (string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                psVar2->_M_string_length = 0;
                *(psVar2->_M_dataplus)._M_p = '\0';
              }
              CoreML::Specification::WeightParams::set_float16value(this_02,"0101010101010101");
              CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
              local_b0 = local_88;
              std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
              if (local_80._M_p != pcVar1) {
                operator_delete(local_80._M_p,local_78._8_8_ + 1);
              }
              bVar3 = CoreML::Result::good((Result *)local_b0);
              if (bVar3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x29c);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," was false, expected true.",0x1a);
              }
              else {
                psVar2 = (this_02->float16value_).ptr_;
                if (psVar2 != (string *)
                              &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
                  psVar2->_M_string_length = 0;
                  *(psVar2->_M_dataplus)._M_p = '\0';
                }
                this = &this_02->floatvalue_;
                iVar13 = (this_02->floatvalue_).current_size_;
                iVar14 = 8;
                do {
                  if (iVar13 == (this_02->floatvalue_).total_size_) {
                    google::protobuf::RepeatedField<float>::Reserve(this,iVar13 + 1);
                    iVar13 = this->current_size_;
                  }
                  lVar12 = (long)iVar13;
                  iVar13 = iVar13 + 1;
                  (this_02->floatvalue_).current_size_ = iVar13;
                  ((this_02->floatvalue_).rep_)->elements[lVar12] = 1.0;
                  iVar14 = iVar14 + -1;
                } while (iVar14 != 0);
                CoreML::validate<(MLModelType)500>((Result *)local_88,&local_60);
                local_b0 = local_88;
                std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_80);
                if (local_80._M_p != pcVar1) {
                  operator_delete(local_80._M_p,local_78._8_8_ + 1);
                }
                bVar3 = CoreML::Result::good((Result *)local_b0);
                if (!bVar3) {
                  this->current_size_ = 0;
                  iVar13 = 0;
                  goto LAB_0015d2b3;
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x2a4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," was false, expected true.",0x1a);
              }
            }
            iVar13 = 1;
            std::endl<char,std::char_traits<char>>(poVar10);
            goto LAB_0015d2b3;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x28f);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x27d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x278);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  iVar13 = 1;
  std::ostream::flush();
LAB_0015d2b3:
  if (local_a8._M_p != local_a0 + 8) {
    operator_delete(local_a8._M_p,local_a0._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_60);
  return iVar13;
}

Assistant:

int testInnerProductDynamicQuantizationConversionParameterValidation() {

    // Setup
    Specification::Model m1;
    Specification::NeuralNetwork *nnWrite = m1.mutable_neuralnetwork();
    nnWrite->set_arrayinputshapemapping(Specification::EXACT_ARRAY_MAPPING);

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    Specification::NeuralNetworkLayer* layer1 = nnWrite->add_layers();
    layer1->set_name("inner_product");
    layer1->add_input("A");
    layer1->add_output("B");
    Specification::InnerProductLayerParams* inner_product_params = layer1->mutable_innerproduct();
    inner_product_params->set_inputchannels(4);
    inner_product_params->set_outputchannels(2);
    inner_product_params->set_hasbias(false);
    inner_product_params->set_int8dynamicquantize(true);

    auto* weights = inner_product_params->mutable_weights();
    weights->set_int8rawvalue("11111111");
    weights->mutable_quantization()->set_numberofbits(8);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Setup: Correct model
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);

    // Case 1: has bias
    inner_product_params->set_hasbias(true);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_GOOD(res);
    inner_product_params->set_hasbias(false);

    // Case 2: Non empty linear quantization bias
    weights->mutable_quantization()->mutable_linearquantization()->add_bias(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->clear_bias();

    // Case 3: numberofbits != 8
    weights->mutable_quantization()->set_numberofbits(7);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->set_numberofbits(8);

    // Case 4: Lookup table mode is on
    weights->mutable_quantization()->mutable_lookuptablequantization()->add_floatvalue(1);
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->mutable_quantization()->mutable_linearquantization()->add_scale(4);

    // Case 5: uint8 weights
    weights->clear_int8rawvalue();
    weights->set_rawvalue("11111111");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_rawvalue();

    // Case 6: float16 weights
    weights->set_float16value("0101010101010101");
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_float16value();

    // Case 7: float weights
    for (int i = 0; i < 8; ++i){
        weights->add_floatvalue(1);
    }
    res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);
    weights->clear_floatvalue();

    return 0;
}